

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

int __thiscall google::protobuf::SourceCodeInfo_Location::ByteSize(SourceCodeInfo_Location *this)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int32 iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int i_1;
  int i;
  
  uVar3 = this->_has_bits_[0];
  iVar8 = 0;
  iVar2 = 0;
  if ((uVar3 & 0x3fc) != 0) {
    iVar2 = 0;
    if ((uVar3 & 4) != 0) {
      iVar2 = internal::WireFormatLite::StringSize(this->leading_comments_);
      iVar2 = iVar2 + 1;
      uVar3 = this->_has_bits_[0];
    }
    if ((uVar3 & 8) != 0) {
      iVar4 = internal::WireFormatLite::StringSize(this->trailing_comments_);
      iVar2 = iVar2 + iVar4 + 1;
    }
  }
  for (iVar4 = 0; iVar4 < (this->path_).current_size_; iVar4 = iVar4 + 1) {
    iVar5 = path(this,iVar4);
    iVar6 = io::CodedOutputStream::VarintSize32SignExtended(iVar5);
    iVar8 = iVar8 + iVar6;
  }
  if (0 < iVar8) {
    iVar4 = io::CodedOutputStream::VarintSize32SignExtended(iVar8);
    iVar2 = iVar2 + iVar4 + 1;
  }
  this->_path_cached_byte_size_ = iVar8;
  iVar6 = 0;
  for (iVar4 = 0; iVar4 < (this->span_).current_size_; iVar4 = iVar4 + 1) {
    iVar5 = span(this,iVar4);
    iVar7 = io::CodedOutputStream::VarintSize32SignExtended(iVar5);
    iVar6 = iVar6 + iVar7;
  }
  iVar2 = iVar2 + iVar8;
  if (0 < iVar6) {
    iVar8 = io::CodedOutputStream::VarintSize32SignExtended(iVar6);
    iVar2 = iVar2 + iVar8 + 1;
  }
  this->_span_cached_byte_size_ = iVar6;
  iVar2 = iVar2 + iVar6;
  pvVar1 = (this->_unknown_fields_).fields_;
  if ((pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    iVar8 = internal::WireFormat::ComputeUnknownFieldsSize(&this->_unknown_fields_);
    iVar2 = iVar8 + iVar2;
  }
  this->_cached_size_ = iVar2;
  return iVar2;
}

Assistant:

int SourceCodeInfo_Location::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[2 / 32] & (0xffu << (2 % 32))) {
    // optional string leading_comments = 3;
    if (has_leading_comments()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->leading_comments());
    }

    // optional string trailing_comments = 4;
    if (has_trailing_comments()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->trailing_comments());
    }

  }
  // repeated int32 path = 1 [packed = true];
  {
    int data_size = 0;
    for (int i = 0; i < this->path_size(); i++) {
      data_size += ::google::protobuf::internal::WireFormatLite::
        Int32Size(this->path(i));
    }
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _path_cached_byte_size_ = data_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated int32 span = 2 [packed = true];
  {
    int data_size = 0;
    for (int i = 0; i < this->span_size(); i++) {
      data_size += ::google::protobuf::internal::WireFormatLite::
        Int32Size(this->span(i));
    }
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _span_cached_byte_size_ = data_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}